

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::AddDefinition(cmMakefile *this,string *name,char *value)

{
  Internals *this_00;
  cmake *pcVar1;
  cmVariableWatch *this_01;
  bool bVar2;
  allocator local_49;
  string local_48;
  
  if (value != (char *)0x0) {
    bVar2 = VariableInitialized(this,name);
    if (bVar2) {
      LogUnused(this,"changing definition",name);
    }
    this_00 = (this->Internal).x_;
    std::__cxx11::string::string((string *)&local_48,value,&local_49);
    Internals::SetDefinition(this_00,name,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    pcVar1 = this->LocalGenerator->GlobalGenerator->CMakeInstance;
    if ((pcVar1 != (cmake *)0x0) &&
       (this_01 = pcVar1->VariableWatch, this_01 != (cmVariableWatch *)0x0)) {
      cmVariableWatch::VariableAccessed(this_01,name,3,value,this);
    }
  }
  return;
}

Assistant:

void cmMakefile::AddDefinition(const std::string& name, const char* value)
{
  if (!value )
    {
    return;
    }

  if (this->VariableInitialized(name))
    {
    this->LogUnused("changing definition", name);
    }
  this->Internal->SetDefinition(name, value);

#ifdef CMAKE_BUILD_WITH_CMAKE
  cmVariableWatch* vv = this->GetVariableWatch();
  if ( vv )
    {
    vv->VariableAccessed(name,
                         cmVariableWatch::VARIABLE_MODIFIED_ACCESS,
                         value,
                         this);
    }
#endif
}